

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*,_char_*,_char_*>
* __thiscall
fmt::v9::
make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608],char*&,char*&,char*&>
          (format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*,_char_*,_char_*>
           *__return_storage_ptr__,v9 *this,char (*args) [4608],char **args_1,char **args_2,
          char **args_3)

{
  longlong lVar1;
  char *pcVar2;
  char *pcVar3;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  char_type **arg;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_const_1;
  bool formattable_char_1;
  char_type **arg_1;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_const_2;
  bool formattable_char_2;
  char_type **arg_2;
  bool formattable_3;
  bool formattable_pointer_3;
  bool formattable_const_3;
  bool formattable_char_3;
  char_type **arg_3;
  size_t local_1e0;
  size_t local_130;
  size_t local_e0;
  size_t local_90;
  char **args_local_3;
  char **args_local_2;
  char **args_local_1;
  char (*args_local) [4608];
  
  lVar1 = *(longlong *)*args;
  pcVar2 = *args_1;
  pcVar3 = *args_2;
  (__return_storage_ptr__->data_).args_[0].field_0.named_args.data = (named_arg_info<char> *)this;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_1e0;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = lVar1;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_130;
  (__return_storage_ptr__->data_).args_[2].field_0.string.data = pcVar2;
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = local_e0;
  (__return_storage_ptr__->data_).args_[3].field_0.string.data = pcVar3;
  (__return_storage_ptr__->data_).args_[3].field_0.string.size = local_90;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {FMT_FORWARD(args)...};
}